

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonParseValue(JsonParse *pParse,u32 i)

{
  u8 *puVar1;
  byte bVar2;
  char *pcVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  char cVar7;
  ulong uVar8;
  uint uVar9;
  u32 uVar10;
  u8 uVar11;
  int iVar12;
  byte bVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  char *__s1;
  bool bVar18;
  ulong uVar13;
  
  pcVar3 = pParse->zJson;
  uVar8 = (ulong)i;
  do {
    uVar13 = uVar8;
    iVar12 = (int)uVar13;
    bVar14 = pcVar3[uVar13];
    uVar16 = iVar12 + 1;
    uVar8 = (ulong)uVar16;
  } while (""[bVar14] != '\0');
  __s1 = pcVar3 + uVar13;
  if (bVar14 < 0x6e) {
    if (bVar14 == 0x22) {
      bVar14 = pcVar3[uVar16];
      if (bVar14 < 0x20) {
        return -1;
      }
      uVar11 = '\0';
      uVar8 = (ulong)uVar16;
      do {
        iVar12 = (int)uVar13;
        if (bVar14 == 0x5c) {
          uVar13 = (ulong)(iVar12 + 2);
          bVar14 = pcVar3[uVar13];
          uVar11 = '\x02';
          if ((0x37 < bVar14 - 0x2f) ||
             ((0x88200000000001U >> ((ulong)(bVar14 - 0x2f) & 0x3f) & 1) == 0)) {
            switch(bVar14) {
            case 0x6e:
            case 0x72:
            case 0x74:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
              return -1;
            case 0x75:
              lVar15 = 0;
              do {
                if ((""[(byte)pcVar3[lVar15 + uVar13 + 1]] & 8) == 0) {
                  return -1;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 != 4);
              break;
            default:
              if (bVar14 != 0x22) {
                return -1;
              }
            }
          }
        }
        else {
          uVar13 = uVar8;
          if (bVar14 == 0x22) {
            jsonParseAddNode(pParse,5,(iVar12 - uVar16) + 3,__s1);
            if (pParse->oom == '\0') {
              pParse->aNode[pParse->nNode - 1].jnFlags = uVar11;
              return iVar12 + 2;
            }
            return iVar12 + 2;
          }
        }
        uVar8 = (ulong)((int)uVar13 + 1);
        bVar14 = pcVar3[uVar8];
      } while (0x1f < bVar14);
      return -1;
    }
    if (bVar14 == 0x5b) {
      uVar16 = jsonParseAddNode(pParse,6,0,(char *)0x0);
      if ((int)uVar16 < 0) {
        return -1;
      }
      do {
        do {
          iVar12 = (int)uVar13;
          uVar13 = (ulong)(iVar12 + 1U);
        } while (""[(byte)pcVar3[uVar13]] != '\0');
        uVar5 = pParse->iDepth + 1;
        pParse->iDepth = uVar5;
        if (2000 < uVar5) {
          return -1;
        }
        uVar17 = jsonParseValue(pParse,iVar12 + 1U);
        pParse->iDepth = pParse->iDepth - 1;
        if ((int)uVar17 < 0) {
          bVar18 = uVar17 == 0xfffffffd;
LAB_001cf688:
          if (!bVar18) {
            return -1;
          }
          if (pParse->nNode == uVar16 + 1) {
            return iVar12 + 2;
          }
          return -1;
        }
        do {
          uVar9 = uVar17;
          bVar14 = pcVar3[uVar9];
          uVar17 = uVar9 + 1;
        } while (""[bVar14] != '\0');
        uVar13 = (ulong)uVar9;
      } while (bVar14 == 0x2c);
      bVar18 = bVar14 == 0x5d;
LAB_001cf4aa:
      if (bVar18) {
        pParse->aNode[uVar16].n = ~uVar16 + pParse->nNode;
        return uVar17;
      }
      return -1;
    }
    if (((bVar14 == 0x66) && (iVar6 = strncmp(__s1,"false",5), iVar6 == 0)) &&
       (uVar17 = iVar12 + 5, (""[(byte)pcVar3[uVar17]] & 6) == 0)) {
      uVar10 = 2;
      goto LAB_001cf635;
    }
  }
  else if (bVar14 == 0x6e) {
    iVar6 = strncmp(__s1,"null",4);
    if ((iVar6 == 0) && (uVar17 = iVar12 + 4, (""[(byte)pcVar3[uVar17]] & 6) == 0)) {
      uVar10 = 0;
LAB_001cf635:
      jsonParseAddNode(pParse,uVar10,0,(char *)0x0);
      return uVar17;
    }
  }
  else if (bVar14 == 0x74) {
    iVar6 = strncmp(__s1,"true",4);
    if ((iVar6 == 0) && (uVar17 = iVar12 + 4, (""[(byte)pcVar3[uVar17]] & 6) == 0)) {
      uVar10 = 1;
      goto LAB_001cf635;
    }
  }
  else if (bVar14 == 0x7b) {
    uVar16 = jsonParseAddNode(pParse,7,0,(char *)0x0);
    if ((int)uVar16 < 0) {
      return -1;
    }
    do {
      do {
        iVar12 = (int)uVar13;
        uVar13 = (ulong)(iVar12 + 1U);
      } while (""[(byte)pcVar3[uVar13]] != '\0');
      uVar5 = pParse->iDepth + 1;
      pParse->iDepth = uVar5;
      if (2000 < uVar5) {
        return -1;
      }
      uVar17 = jsonParseValue(pParse,iVar12 + 1U);
      if ((int)uVar17 < 0) {
        pParse->iDepth = pParse->iDepth - 1;
        bVar18 = uVar17 == 0xfffffffe;
        goto LAB_001cf688;
      }
      if (pParse->oom != '\0') {
        return -1;
      }
      uVar9 = pParse->nNode - 1;
      if (pParse->aNode[uVar9].eType != '\x05') {
        return -1;
      }
      puVar1 = &pParse->aNode[uVar9].jnFlags;
      *puVar1 = *puVar1 | 0x40;
      do {
        uVar8 = (ulong)uVar17;
        uVar17 = uVar17 + 1;
      } while (""[(byte)pcVar3[uVar8]] != '\0');
      if (pcVar3[uVar8] != 0x3a) {
        return -1;
      }
      uVar17 = jsonParseValue(pParse,uVar17);
      pParse->iDepth = pParse->iDepth - 1;
      if ((int)uVar17 < 0) {
        return -1;
      }
      do {
        uVar9 = uVar17;
        bVar14 = pcVar3[uVar9];
        uVar17 = uVar9 + 1;
      } while (""[bVar14] != '\0');
      uVar13 = (ulong)uVar9;
    } while (bVar14 == 0x2c);
    bVar18 = bVar14 == 0x7d;
    goto LAB_001cf4aa;
  }
  if (bVar14 == 0x2d || (byte)(bVar14 - 0x30) < 10) {
    if (((bVar14 < 0x31) && (pcVar3[((bVar14 == 0x2d) + uVar16) - 1] == '0')) &&
       ((byte)(pcVar3[(bVar14 == 0x2d) + uVar16] - 0x30U) < 10)) {
      return -1;
    }
    bVar14 = 1;
    bVar4 = bVar14;
    do {
      while( true ) {
        uVar10 = ((int)uVar13 - uVar16) + 1;
        do {
          uVar8 = uVar13;
          iVar12 = (int)uVar8;
          uVar13 = (ulong)(iVar12 + 1U);
          bVar2 = pcVar3[uVar13];
          uVar10 = uVar10 + 1;
        } while ((byte)(bVar2 - 0x30) < 10);
        if (bVar2 == 0x2e) break;
        if ((bVar2 & 0xdf) != 0x45) {
          if ('/' < pcVar3[uVar8]) {
            jsonParseAddNode(pParse,4 - bVar14,uVar10,__s1);
            return iVar12 + 1U;
          }
          return -1;
        }
        if ((~bVar4 & 1) != 0 || pcVar3[uVar8] < '0') {
          return -1;
        }
        cVar7 = pcVar3[iVar12 + 2];
        if ((cVar7 == '-') || (cVar7 == '+')) {
          cVar7 = pcVar3[iVar12 + 3];
          uVar13 = (ulong)(iVar12 + 2);
        }
        bVar14 = 0;
        bVar4 = bVar14;
        if ((byte)(cVar7 - 0x3aU) < 0xf6) {
          return -1;
        }
      }
      bVar18 = (bool)(pcVar3[uVar8] != '-' & bVar14);
      bVar14 = 0;
    } while (bVar18);
  }
  else {
    if (bVar14 == 0) {
      return 0;
    }
    if (bVar14 == 0x7d) {
      return -2;
    }
    if (bVar14 == 0x5d) {
      return -3;
    }
  }
  return -1;
}

Assistant:

static int jsonParseValue(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  int iThis;
  int x;
  JsonNode *pNode;
  const char *z = pParse->zJson;
  while( safe_isspace(z[i]) ){ i++; }
  if( (c = z[i])=='{' ){
    /* Parse object */
    iThis = jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( safe_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      if( x<0 ){
        pParse->iDepth--;
        if( x==(-2) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      if( pParse->oom ) return -1;
      pNode = &pParse->aNode[pParse->nNode-1];
      if( pNode->eType!=JSON_STRING ) return -1;
      pNode->jnFlags |= JNODE_LABEL;
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      if( z[j]!=':' ) return -1;
      j++;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ) return -1;
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!='}' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='[' ){
    /* Parse array */
    iThis = jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( safe_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ){
        if( x==(-3) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!=']' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='"' ){
    /* Parse string */
    u8 jnFlags = 0;
    j = i+1;
    for(;;){
      c = z[j];
      if( (c & ~0x1f)==0 ){
        /* Control characters are not allowed in strings */
        return -1;
      }
      if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(z+j+1)) ){
          jnFlags = JNODE_ESCAPE;
        }else{
          return -1;
        }
      }else if( c=='"' ){
        break;
      }
      j++;
    }
    jsonParseAddNode(pParse, JSON_STRING, j+1-i, &z[i]);
    if( !pParse->oom ) pParse->aNode[pParse->nNode-1].jnFlags = jnFlags;
    return j+1;
  }else if( c=='n'
         && strncmp(z+i,"null",4)==0
         && !safe_isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return i+4;
  }else if( c=='t'
         && strncmp(z+i,"true",4)==0
         && !safe_isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
    return i+4;
  }else if( c=='f'
         && strncmp(z+i,"false",5)==0
         && !safe_isalnum(z[i+5]) ){
    jsonParseAddNode(pParse, JSON_FALSE, 0, 0);
    return i+5;
  }else if( c=='-' || (c>='0' && c<='9') ){
    /* Parse number */
    u8 seenDP = 0;
    u8 seenE = 0;
    assert( '-' < '0' );
    if( c<='0' ){
      j = c=='-' ? i+1 : i;
      if( z[j]=='0' && z[j+1]>='0' && z[j+1]<='9' ) return -1;
    }
    j = i+1;
    for(;; j++){
      c = z[j];
      if( c>='0' && c<='9' ) continue;
      if( c=='.' ){
        if( z[j-1]=='-' ) return -1;
        if( seenDP ) return -1;
        seenDP = 1;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ) return -1;
        if( seenE ) return -1;
        seenDP = seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ) return -1;
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ) return -1;
    jsonParseAddNode(pParse, seenDP ? JSON_REAL : JSON_INT,
                        j - i, &z[i]);
    return j;
  }else if( c=='}' ){
    return -2;  /* End of {...} */
  }else if( c==']' ){
    return -3;  /* End of [...] */
  }else if( c==0 ){
    return 0;   /* End of file */
  }else{
    return -1;  /* Syntax error */
  }
}